

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O3

bool __thiscall Debugger::Initialize(Debugger *this)

{
  JsContextRef *ppvVar1;
  bool bVar2;
  JsErrorCode JVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  undefined8 extraout_RAX;
  char16_t *format;
  Debugger *this_00;
  long unaff_R12;
  JsValueRef local_80;
  JsValueRef args [1];
  JsValueRef result;
  JsValueRef scriptSource;
  JsValueRef fname;
  JsValueRef undefinedValue;
  JsValueRef globalObj;
  JsPropertyIdRef hostDebugObjectPropId;
  JsPropertyIdRef hostDebugObject;
  AutoRestoreContext autoRestoreContext;
  JsValueRef globalFunc;
  
  if (this->m_context != (JsContextRef)0x0) {
    Initialize();
    if (((char)autoRestoreContext.oldContext == '\x01') && (hostDebugObject != (JsPropertyIdRef)0x0)
       ) {
      (**(code **)(unaff_R12 + 0x28))();
    }
    _Unwind_Resume(extraout_RAX);
  }
  ppvVar1 = &this->m_context;
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateContext)(this->m_runtime,ppvVar1);
  if (JVar3 != JsNoError) {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(JVar3);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context) failed. JsErrorCode=0x%x (%s)\n"
    ;
LAB_0010ba12:
    PAL_fwprintf(pPVar4,format,(ulong)JVar3,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
    return false;
  }
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)(*ppvVar1,(uint *)0x0);
  if (JVar3 != JsNoError) {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(JVar3);
    format = 
    L"ERROR: ChakraRTInterface::JsAddRef(this->m_context, nullptr) failed. JsErrorCode=0x%x (%s)\n";
    goto LAB_0010ba12;
  }
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)&hostDebugObject,*ppvVar1);
  autoRestoreContext.contextChanged = false;
  autoRestoreContext._9_7_ = 0;
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                    ("//-------------------------------------------------------------------------------------------------------\n// Copyright (C) Microsoft. All rights reserved.\n// Copyright (c) 2021 ChakraCore Project Contributors. All rights reserved.\n// Licensed under the MIT license. See LICENSE.txt file in the project root for full license information.\n//-------------------------------------------------------------------------------------------------------\n\nvar TRACE_NONE = 0x0000;\nvar TRACE_COMMANDS = 0x001;\nvar TRACE_DIAG_OUTPUT = 0x002;\nvar TRACE_INTERNAL_FUNCTIONS = 0x004;\nvar TRACE_DEBUG_EVENTS = 0x008;\nvar TRACE_ALL = TRACE_COMMANDS | TRACE_DIAG_OUTPUT | TRACE_INTERNAL_FUNCTIONS | TRACE_DEBUG_EVENTS;\n\n// Have all JsDiag* functions installed on it by Debugger.cpp\nvar hostDebugObject = {};\n\nvar controllerObj = (function () {\n    var _commandList = [];\n    var _commandCompletions = [];\n    var _wasResumed = false;\n    var _currentStackFrameIndex = 0;\n    var _trace = TRACE_NONE;\n    var _eventLog = [];\n    var _baseline = undefined;\n    var _exceptionCommands = undefined;\n    var _onasyncbreakCommands = undefined;\n    var _inspectMaxStringLength = 16;\n\n    function internalPrint(str) {\n        WScript.Echo(str);\n    }\n\n    function isTracing(traceFlag) {\n        return _trace & traceFlag;\n    }\n\n    function internalTrace(traceFlag, ...varArgs) {\n        if (isTracing(traceFlag)) {\n            var str = \"\";\n            varArgs.map(function (element) {\n                str += (typeof element != \"string\") ? JSON.stringify(element, undefined, \"  \") : element;\n            });\n            internalPrint(str);\n        }\n    }\n\n    function printError(str) {\n        internalPrint(\"Error: \" + str);\n    }\n\n    function callHostFunction(fn) {\n        var result = fn.apply(undefined, [].slice.call(arguments, 1));\n        var obj = {};\n        obj[fn.name] = result;\n        internalTrace(TRACE_DIAG_OUTPUT, obj);\n        return result;\n    }\n\n    filterLog = (function () {\n        var parentFilter = { \"this\": 1, \"locals\": 1, \"globals\": 1 };\n ..." /* TRUNCATED STRING LITERAL */
                     ,0x9d77,(JsFinalizeCallback)0x0,(void *)0x0,&result);
  if (JVar3 == JsNoError) {
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)("DbgController.js",0x10,&scriptSource);
    JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtParse)
                      (result,0xffffffffffffffff,scriptSource,JsParseScriptAttributeLibraryCode,
                       (JsValueRef *)&autoRestoreContext.contextChanged);
    if (JVar3 == JsNoError) {
      JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&fname);
      if (JVar3 == JsNoError) {
        local_80 = fname;
        args[0] = (JsValueRef)0x0;
        JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                          ((JsValueRef)autoRestoreContext._8_8_,&local_80,1,args);
        if (JVar3 == JsNoError) {
          undefinedValue = (JsValueRef)0x0;
          JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)(&undefinedValue);
          if (JVar3 == JsNoError) {
            JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                              ("hostDebugObject",0xf,&globalObj);
            if (JVar3 == JsNoError) {
              this_00 = (Debugger *)undefinedValue;
              JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                (undefinedValue,globalObj,&hostDebugObjectPropId);
              if (JVar3 == JsNoError) {
                InstallDebugCallbacks(this_00,hostDebugObjectPropId);
                bVar2 = WScriptJsrt::Initialize();
                if (bVar2) {
                  if (HostConfigFlags::flags.dbgbaselineIsEnabled == true) {
                    SetBaseline(this);
                  }
                  bVar2 = true;
                  if (HostConfigFlags::flags.InspectMaxStringLengthIsEnabled == true) {
                    SetInspectMaxStringLength(this);
                  }
                  goto LAB_0010bd33;
                }
              }
              else {
                pPVar4 = PAL_get_stderr(0);
                pWVar5 = Helpers::JsErrorCodeToString(JVar3);
                PAL_fwprintf(pPVar4,
                             L"ERROR: ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject) failed. JsErrorCode=0x%x (%s)\n"
                             ,(ulong)JVar3,pWVar5);
                pPVar4 = PAL_get_stderr(0);
                PAL_fflush(pPVar4);
              }
            }
            else {
              pPVar4 = PAL_get_stderr(0);
              pWVar5 = Helpers::JsErrorCodeToString(JVar3);
              PAL_fwprintf(pPVar4,
                           L"ERROR: CreatePropertyIdFromString(\"hostDebugObject\", &hostDebugObjectPropId) failed. JsErrorCode=0x%x (%s)\n"
                           ,(ulong)JVar3,pWVar5);
              pPVar4 = PAL_get_stderr(0);
              PAL_fflush(pPVar4);
            }
          }
          else {
            pPVar4 = PAL_get_stderr(0);
            pWVar5 = Helpers::JsErrorCodeToString(JVar3);
            PAL_fwprintf(pPVar4,
                         L"ERROR: ChakraRTInterface::JsGetGlobalObject(&globalObj) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar3,pWVar5);
            pPVar4 = PAL_get_stderr(0);
            PAL_fflush(pPVar4);
          }
        }
        else {
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = Helpers::JsErrorCodeToString(JVar3);
          PAL_fwprintf(pPVar4,
                       L"ERROR: ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar3,pWVar5);
          pPVar4 = PAL_get_stderr(0);
          PAL_fflush(pPVar4);
        }
      }
      else {
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = Helpers::JsErrorCodeToString(JVar3);
        PAL_fwprintf(pPVar4,
                     L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&undefinedValue) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar3,pWVar5);
        pPVar4 = PAL_get_stderr(0);
        PAL_fflush(pPVar4);
      }
    }
    else {
      pPVar4 = PAL_get_stderr(0);
      pWVar5 = Helpers::JsErrorCodeToString(JVar3);
      PAL_fwprintf(pPVar4,
                   L"ERROR: ChakraRTInterface::JsParse(scriptSource, JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode, &globalFunc) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar3,pWVar5);
      pPVar4 = PAL_get_stderr(0);
      PAL_fflush(pPVar4);
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(JVar3);
    PAL_fwprintf(pPVar4,
                 L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer( (void*)controllerScript, (unsigned int)strlen(controllerScript), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar3,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
  }
  bVar2 = false;
LAB_0010bd33:
  if ((char)autoRestoreContext.oldContext != '\x01') {
    return bVar2;
  }
  if (hostDebugObject == (JsPropertyIdRef)0x0) {
    return bVar2;
  }
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtSetCurrentContext)(hostDebugObject);
  return bVar2;
}

Assistant:

bool Debugger::Initialize()
{
    // Create a new context and run dbgcontroller.js in that context
    // setup dbgcontroller.js callbacks

    Assert(this->m_context == JS_INVALID_REFERENCE);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateContext(this->m_runtime, &this->m_context));
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsAddRef(this->m_context, nullptr)); // Pin context

    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef globalFunc = JS_INVALID_REFERENCE;
    JsValueRef scriptSource;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCreateExternalArrayBuffer(
        (void*)controllerScript, (unsigned int)strlen(controllerScript),
        nullptr, nullptr, &scriptSource));
    JsValueRef fname;
    ChakraRTInterface::JsCreateString(
        "DbgController.js", strlen("DbgController.js"), &fname);
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsParse(scriptSource,
        JS_SOURCE_CONTEXT_NONE, fname, JsParseScriptAttributeLibraryCode,
        &globalFunc));

    JsValueRef undefinedValue;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetUndefinedValue(&undefinedValue));

    JsValueRef args[] = { undefinedValue };
    JsValueRef result = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCallFunction(globalFunc, args, _countof(args), &result));

    JsValueRef globalObj = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetGlobalObject(&globalObj));

    JsPropertyIdRef hostDebugObjectPropId;
    IfJsrtErrorFailLogAndRetFalse(CreatePropertyIdFromString("hostDebugObject", &hostDebugObjectPropId));

    JsPropertyIdRef hostDebugObject;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetProperty(globalObj, hostDebugObjectPropId, &hostDebugObject));

    this->InstallDebugCallbacks(hostDebugObject);

    if (!WScriptJsrt::Initialize())
    {
        return false;
    }

    if (HostConfigFlags::flags.dbgbaselineIsEnabled)
    {
        this->SetBaseline();
    }

    if (HostConfigFlags::flags.InspectMaxStringLengthIsEnabled)
    {
        this->SetInspectMaxStringLength();
    }

    return true;
}